

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.cc
# Opt level: O2

string * __thiscall
abi_test::internal::FixVAArgsString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,(char *)this,(allocator<char> *)&local_90);
  uVar2 = std::__cxx11::string::find((char)&ret,0x2c);
  uVar3 = uVar2;
  if (uVar2 == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,&ret,"()");
  }
  else {
    do {
      if (ret._M_string_length <= uVar3 + 1) break;
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (ret._M_dataplus._M_p[lVar1] == ' ');
    do {
      if (uVar2 == 0) break;
      lVar1 = uVar2 - 1;
      uVar2 = uVar2 - 1;
    } while (ret._M_dataplus._M_p[lVar1] == ' ');
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&ret);
    std::operator+(&local_30,&local_50,"(");
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&ret);
    std::operator+(&local_90,&local_30,&local_70);
    std::operator+(__return_storage_ptr__,&local_90,")");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string FixVAArgsString(const char *str) {
  std::string ret = str;
  size_t idx = ret.find(',');
  if (idx == std::string::npos) {
    return ret + "()";
  }
  size_t idx2 = idx + 1;
  while (idx2 < ret.size() && ret[idx2] == ' ') {
    idx2++;
  }
  while (idx > 0 && ret[idx - 1] == ' ') {
    idx--;
  }
  return ret.substr(0, idx) + "(" + ret.substr(idx2) + ")";
}